

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLpDimensions(HighsLogOptions *log_options,HighsLp *lp)

{
  uint uVar1;
  uint *puVar2;
  HighsLp *in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt num_int;
  HighsInt lp_num_nz;
  uint local_14;
  
  if (in_RSI->num_col_ == 0) {
    local_14 = 0;
  }
  else {
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&(in_RSI->a_matrix_).start_,(long)in_RSI->num_col_);
    local_14 = *puVar2;
  }
  highsLogUser(in_RDI,kInfo,"LP has %d columns, %d rows",(ulong)(uint)in_RSI->num_col_,
               (ulong)(uint)in_RSI->num_row_);
  uVar1 = getNumInt(in_RSI);
  if (uVar1 == 0) {
    highsLogUser(in_RDI,kInfo," and %d nonzeros\n",(ulong)local_14,0);
  }
  else {
    highsLogUser(in_RDI,kInfo,", %d nonzeros and %d integer columns\n",(ulong)local_14,(ulong)uVar1)
    ;
  }
  return;
}

Assistant:

void reportLpDimensions(const HighsLogOptions& log_options, const HighsLp& lp) {
  HighsInt lp_num_nz;
  if (lp.num_col_ == 0)
    lp_num_nz = 0;
  else
    lp_num_nz = lp.a_matrix_.start_[lp.num_col_];
  highsLogUser(log_options, HighsLogType::kInfo,
               "LP has %" HIGHSINT_FORMAT " columns, %" HIGHSINT_FORMAT " rows",
               lp.num_col_, lp.num_row_);
  HighsInt num_int = getNumInt(lp);
  if (num_int) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 ", %" HIGHSINT_FORMAT " nonzeros and %" HIGHSINT_FORMAT
                 " integer columns\n",
                 lp_num_nz, num_int);
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 " and %" HIGHSINT_FORMAT " nonzeros\n", lp_num_nz, num_int);
  }
}